

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O3

void P_CopyPlane(int tag,sector_t_conflict *dest,bool copyCeil)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  sector_t_conflict *psVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  FSectorTagIterator it;
  FSectorTagIterator local_18;
  
  if (tag == 0) {
    local_18.start = 0;
  }
  else {
    local_18.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_18.searchtag = tag;
  iVar5 = FSectorTagIterator::Next(&local_18);
  psVar4 = sectors;
  if (iVar5 != -1) {
    lVar6 = 0xb0;
    if (copyCeil) {
      lVar6 = 0xd8;
    }
    lVar7 = 0xc0;
    if (copyCeil) {
      lVar7 = 0xe8;
    }
    lVar8 = 0xb8;
    if (copyCeil) {
      lVar8 = 0xe0;
    }
    lVar9 = 200;
    if (copyCeil) {
      lVar9 = 0xf0;
    }
    *(undefined8 *)((long)&dest->planes[0].xform.xOffs + lVar7) =
         *(undefined8 *)((long)&sectors[iVar5].planes[0].xform.xOffs + lVar7);
    *(undefined8 *)((long)&dest->planes[0].xform.xOffs + lVar8) =
         *(undefined8 *)((long)&psVar4[iVar5].planes[0].xform.xOffs + lVar8);
    *(undefined8 *)((long)&dest->planes[0].xform.xOffs + lVar6) =
         *(undefined8 *)((long)&psVar4[iVar5].planes[0].xform.xOffs + lVar6);
    puVar1 = (undefined8 *)((long)&psVar4[iVar5].planes[0].xform.xOffs + lVar9);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)((long)&dest->planes[0].xform.xOffs + lVar9);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  return;
}

Assistant:

static void P_CopyPlane (int tag, sector_t *dest, bool copyCeil)
{
	sector_t *source;
	int secnum;

	secnum = P_FindFirstSectorFromTag (tag);
	if (secnum == -1)
	{
		return;
	}

	source = &sectors[secnum];

	if (copyCeil)
	{
		dest->ceilingplane = source->ceilingplane;
	}
	else
	{
		dest->floorplane = source->floorplane;
	}
}